

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  stbi_uc *psVar1;
  undefined1 auVar2 [64];
  ushort uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  char cVar7;
  stbi__uint16 sVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  stbi_uc *psVar17;
  stbi__uint16 *data;
  stbi_uc *psVar18;
  ulong uVar19;
  stbi_uc *psVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  stbi_uc sVar24;
  uint y_00;
  uint uVar25;
  stbi__uint16 *psVar26;
  stbi__uint16 *psVar27;
  uint x_00;
  byte *pbVar28;
  stbi__uint16 *psVar29;
  long lVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  float fVar34;
  float fVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [12];
  undefined1 auVar41 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar43 [16];
  undefined1 in_register_000013c4 [12];
  stbi__uint16 *local_e8;
  undefined1 auVar36 [16];
  
  iVar9 = stbi__get16be(s);
  uVar10 = stbi__get16be(s);
  if ((uVar10 | iVar9 << 0x10) != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (void *)0x0;
  }
  iVar9 = stbi__get16be(s);
  if (iVar9 != 1) {
    stbi__g_failure_reason = "wrong version";
    return (void *)0x0;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar17 = s->img_buffer;
  }
  else {
    psVar17 = s->img_buffer;
    iVar9 = (int)s->img_buffer_end - (int)psVar17;
    if (iVar9 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar9);
      goto LAB_00168441;
    }
  }
  s->img_buffer = psVar17 + 6;
LAB_00168441:
  uVar10 = stbi__get16be(s);
  if (uVar10 < 0x11) {
    iVar9 = stbi__get16be(s);
    iVar11 = stbi__get16be(s);
    iVar12 = stbi__get16be(s);
    iVar13 = stbi__get16be(s);
    iVar14 = stbi__get16be(s);
    if ((iVar14 == 8) || (iVar14 == 0x10)) {
      iVar15 = stbi__get16be(s);
      if (iVar15 == 3) {
        iVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        stbi__skip(s,iVar15 << 0x10 | uVar16);
        iVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        stbi__skip(s,iVar15 << 0x10 | uVar16);
        iVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        stbi__skip(s,iVar15 << 0x10 | uVar16);
        uVar16 = stbi__get16be(s);
        if (uVar16 < 2) {
          iVar9 = iVar9 * 0x10000;
          y_00 = iVar9 + iVar11;
          iVar12 = iVar12 * 0x10000;
          x_00 = iVar12 + iVar13;
          iVar15 = stbi__mad3sizes_valid(4,x_00,y_00,0);
          if (iVar15 == 0) {
            stbi__g_failure_reason = "too large";
          }
          else {
            if (((bpc == 0x10) && (iVar14 == 0x10)) && (uVar16 == 0)) {
              data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,y_00,0);
              ri->bits_per_channel = 0x10;
            }
            else {
              data = (stbi__uint16 *)malloc((long)(int)(y_00 * x_00 * 4));
            }
            if (data != (stbi__uint16 *)0x0) {
              uVar21 = x_00 * y_00;
              if (uVar16 == 0) {
                psVar26 = data + 0x7e;
                psVar29 = data + 0x7c;
                psVar17 = s->buffer_start;
                psVar1 = s->buffer_start + 1;
                auVar31 = vpbroadcastq_avx512f();
                uVar16 = (iVar11 + iVar9) * (iVar13 + iVar12);
                auVar2 = vmovdqu64_avx512f(auVar31);
                uVar19 = 0;
                psVar27 = data;
                local_e8 = data;
                do {
                  if (uVar19 < uVar10) {
                    if (ri->bits_per_channel == 0x10) {
                      if (0 < (int)uVar21) {
                        lVar30 = 0;
                        do {
                          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                          iVar15 = stbi__get16be(s);
                          auVar31 = vmovdqu64_avx512f(auVar2);
                          local_e8[lVar30 * 4] = (stbi__uint16)iVar15;
                          lVar30 = lVar30 + 1;
                        } while (uVar16 != (uint)lVar30);
                      }
                    }
                    else if (iVar14 == 0x10) {
                      if (0 < (int)uVar21) {
                        lVar30 = 0;
                        do {
                          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                          iVar15 = stbi__get16be(s);
                          auVar31 = vmovdqu64_avx512f(auVar2);
                          *(char *)(psVar27 + lVar30 * 2) = (char)((uint)iVar15 >> 8);
                          lVar30 = lVar30 + 1;
                        } while (uVar16 != (uint)lVar30);
                      }
                    }
                    else if (0 < (int)uVar21) {
                      psVar18 = s->img_buffer;
                      psVar20 = s->img_buffer_end;
                      lVar30 = 0;
                      do {
                        if (psVar18 < psVar20) {
                          s->img_buffer = psVar18 + 1;
                          sVar24 = *psVar18;
                          psVar18 = psVar18 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          sVar24 = '\0';
                        }
                        else {
                          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                          iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                          if (iVar15 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            sVar24 = '\0';
                            psVar20 = psVar1;
                          }
                          else {
                            sVar24 = *psVar17;
                            psVar20 = psVar17 + iVar15;
                          }
                          auVar31 = vmovdqu64_avx512f(auVar2);
                          s->img_buffer_end = psVar20;
                          s->img_buffer = psVar1;
                          psVar18 = psVar1;
                        }
                        *(stbi_uc *)(psVar27 + lVar30 * 2) = sVar24;
                        lVar30 = lVar30 + 1;
                      } while (uVar16 != (uint)lVar30);
                    }
                  }
                  else if (iVar14 == 0x10 && bpc == 0x10) {
                    if (0 < (int)uVar21) {
                      uVar22 = 0;
                      sVar8 = -(ushort)(uVar19 == 3);
                      do {
                        auVar32 = vpbroadcastq_avx512f();
                        auVar33 = vporq_avx512f(auVar32,_DAT_001c6a00);
                        uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                        if ((uVar5 & 1) != 0) {
                          psVar29[uVar22 * 4 + -0x7c] = sVar8;
                        }
                        if ((uVar5 & 2) != 0) {
                          psVar29[uVar22 * 4 + -0x78] = sVar8;
                        }
                        if ((uVar5 & 4) != 0) {
                          psVar29[uVar22 * 4 + -0x74] = sVar8;
                        }
                        if ((uVar5 & 8) != 0) {
                          psVar29[uVar22 * 4 + -0x70] = sVar8;
                        }
                        if ((uVar5 & 0x10) != 0) {
                          psVar29[uVar22 * 4 + -0x6c] = sVar8;
                        }
                        if ((uVar5 & 0x20) != 0) {
                          psVar29[uVar22 * 4 + -0x68] = sVar8;
                        }
                        if ((uVar5 & 0x40) != 0) {
                          psVar29[uVar22 * 4 + -100] = sVar8;
                        }
                        if ((uVar5 & 0x80) != 0) {
                          psVar29[uVar22 * 4 + -0x60] = sVar8;
                        }
                        auVar33 = vporq_avx512f(auVar32,_DAT_001c69c0);
                        uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                        if ((uVar5 & 1) != 0) {
                          psVar29[uVar22 * 4 + -0x5c] = sVar8;
                        }
                        if ((uVar5 & 2) != 0) {
                          psVar29[uVar22 * 4 + -0x58] = sVar8;
                        }
                        if ((uVar5 & 4) != 0) {
                          psVar29[uVar22 * 4 + -0x54] = sVar8;
                        }
                        if ((uVar5 & 8) != 0) {
                          psVar29[uVar22 * 4 + -0x50] = sVar8;
                        }
                        if ((uVar5 & 0x10) != 0) {
                          psVar29[uVar22 * 4 + -0x4c] = sVar8;
                        }
                        if ((uVar5 & 0x20) != 0) {
                          psVar29[uVar22 * 4 + -0x48] = sVar8;
                        }
                        if ((uVar5 & 0x40) != 0) {
                          psVar29[uVar22 * 4 + -0x44] = sVar8;
                        }
                        if ((uVar5 & 0x80) != 0) {
                          psVar29[uVar22 * 4 + -0x40] = sVar8;
                        }
                        auVar33 = vporq_avx512f(auVar32,_DAT_001c6980);
                        uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                        if ((uVar5 & 1) != 0) {
                          psVar29[uVar22 * 4 + -0x3c] = sVar8;
                        }
                        if ((uVar5 & 2) != 0) {
                          psVar29[uVar22 * 4 + -0x38] = sVar8;
                        }
                        if ((uVar5 & 4) != 0) {
                          psVar29[uVar22 * 4 + -0x34] = sVar8;
                        }
                        if ((uVar5 & 8) != 0) {
                          psVar29[uVar22 * 4 + -0x30] = sVar8;
                        }
                        if ((uVar5 & 0x10) != 0) {
                          psVar29[uVar22 * 4 + -0x2c] = sVar8;
                        }
                        if ((uVar5 & 0x20) != 0) {
                          psVar29[uVar22 * 4 + -0x28] = sVar8;
                        }
                        if ((uVar5 & 0x40) != 0) {
                          psVar29[uVar22 * 4 + -0x24] = sVar8;
                        }
                        if ((uVar5 & 0x80) != 0) {
                          psVar29[uVar22 * 4 + -0x20] = sVar8;
                        }
                        auVar32 = vporq_avx512f(auVar32,_DAT_001c6940);
                        uVar5 = vpcmpuq_avx512f(auVar32,auVar31,2);
                        if ((uVar5 & 1) != 0) {
                          psVar29[uVar22 * 4 + -0x1c] = sVar8;
                        }
                        if ((uVar5 & 2) != 0) {
                          psVar29[uVar22 * 4 + -0x18] = sVar8;
                        }
                        if ((uVar5 & 4) != 0) {
                          psVar29[uVar22 * 4 + -0x14] = sVar8;
                        }
                        if ((uVar5 & 8) != 0) {
                          psVar29[uVar22 * 4 + -0x10] = sVar8;
                        }
                        if ((uVar5 & 0x10) != 0) {
                          psVar29[uVar22 * 4 + -0xc] = sVar8;
                        }
                        if ((uVar5 & 0x20) != 0) {
                          psVar29[uVar22 * 4 + -8] = sVar8;
                        }
                        if ((uVar5 & 0x40) != 0) {
                          psVar29[uVar22 * 4 + -4] = sVar8;
                        }
                        if ((uVar5 & 0x80) != 0) {
                          psVar29[uVar22 * 4] = sVar8;
                        }
                        uVar22 = uVar22 + 0x20;
                      } while (((ulong)uVar16 + 0x1f & 0xffffffffffffffe0) != uVar22);
                    }
                  }
                  else if (0 < (int)uVar21) {
                    cVar7 = -(uVar19 == 3);
                    uVar22 = 0;
                    do {
                      auVar32 = vpbroadcastq_avx512f();
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6a00);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x7e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x7c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x7a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x78) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x76) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x74) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x72) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x70) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c69c0);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x6e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x6c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x6a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x68) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x66) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -100) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x62) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x60) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6980);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x5e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x5c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x5a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x58) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x56) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x54) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x52) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x50) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6940);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x4e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x4c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x4a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x48) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x46) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x44) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x42) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x40) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6900);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x3e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x3c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x3a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x38) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x36) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x34) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x32) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x30) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c68c0);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x2e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x2c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x2a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x28) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x26) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x24) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x22) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x20) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6880);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x1e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x1c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x1a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x18) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x16) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x14) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x12) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x10) = cVar7;
                      }
                      auVar32 = vporq_avx512f(auVar32,_DAT_001c6840);
                      uVar5 = vpcmpuq_avx512f(auVar32,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0xe) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0xc) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -10) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -8) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -6) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -4) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -2) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2) = cVar7;
                      }
                      uVar22 = uVar22 + 0x40;
                    } while (((ulong)uVar16 + 0x3f & 0xffffffffffffffc0) != uVar22);
                  }
                  auVar42 = in_ZMM5._4_12_;
                  local_e8 = local_e8 + 1;
                  psVar26 = (stbi__uint16 *)((long)psVar26 + 1);
                  psVar29 = psVar29 + 1;
                  psVar27 = (stbi__uint16 *)((long)psVar27 + 1);
                  uVar19 = uVar19 + 1;
                } while (uVar19 != 4);
              }
              else {
                stbi__skip(s,uVar10 * y_00 * 2);
                psVar17 = s->buffer_start;
                psVar1 = s->buffer_start + 1;
                auVar31 = vpbroadcastq_avx512f();
                psVar26 = data + 0x7e;
                auVar2 = vmovdqu64_avx512f(auVar31);
                uVar19 = 0;
                do {
                  if (uVar19 < uVar10) {
                    if (0 < (int)uVar21) {
                      iVar14 = 0;
                      pbVar28 = (byte *)((long)data + uVar19);
                      uVar16 = uVar21;
                      do {
                        pbVar4 = s->img_buffer;
                        psVar18 = s->img_buffer_end;
                        if (pbVar4 < psVar18) {
                          s->img_buffer = pbVar4 + 1;
                          bVar23 = *pbVar4;
                          psVar20 = pbVar4 + 1;
LAB_0016879b:
                          if (bVar23 != 0x80) {
                            uVar25 = (uint)bVar23;
                            if (-1 < (char)bVar23) {
                              if (uVar16 <= bVar23) {
LAB_00168d91:
                                free(data);
                                stbi__g_failure_reason = "corrupt";
                                return (void *)0x0;
                              }
                              goto LAB_001687b8;
                            }
                            uVar25 = 0x101 - bVar23;
                            if (uVar16 < uVar25) goto LAB_00168d91;
                            if (psVar20 < psVar18) {
                              s->img_buffer = psVar20 + 1;
                              bVar6 = *psVar20;
                            }
                            else if (s->read_from_callbacks == 0) {
                              bVar6 = 0;
                            }
                            else {
                              in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                              iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                              if (iVar15 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                bVar6 = 0;
                                psVar18 = psVar1;
                              }
                              else {
                                bVar6 = *psVar17;
                                psVar18 = psVar17 + iVar15;
                              }
                              auVar31 = vmovdqu64_avx512f(auVar2);
                              s->img_buffer_end = psVar18;
                              s->img_buffer = psVar1;
                            }
                            iVar15 = bVar23 - 0x101;
                            do {
                              *pbVar28 = bVar6;
                              pbVar28 = pbVar28 + 4;
                              iVar15 = iVar15 + 1;
                            } while (iVar15 != 0);
                            goto LAB_00168903;
                          }
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                            iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                            if (iVar15 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar23 = 0;
                              psVar18 = psVar1;
                            }
                            else {
                              bVar23 = *psVar17;
                              psVar18 = psVar17 + iVar15;
                            }
                            auVar31 = vmovdqu64_avx512f(auVar2);
                            s->img_buffer_end = psVar18;
                            s->img_buffer = psVar1;
                            psVar20 = psVar1;
                            goto LAB_0016879b;
                          }
                          uVar25 = 0;
LAB_001687b8:
                          uVar25 = uVar25 + 1;
                          uVar16 = uVar25;
                          do {
                            pbVar4 = s->img_buffer;
                            if (pbVar4 < s->img_buffer_end) {
                              s->img_buffer = pbVar4 + 1;
                              bVar23 = *pbVar4;
                            }
                            else if (s->read_from_callbacks == 0) {
                              bVar23 = 0;
                            }
                            else {
                              in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                              iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                              if (iVar15 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                bVar23 = 0;
                                psVar18 = psVar1;
                              }
                              else {
                                bVar23 = *psVar17;
                                psVar18 = psVar17 + iVar15;
                              }
                              auVar31 = vmovdqu64_avx512f(auVar2);
                              s->img_buffer_end = psVar18;
                              s->img_buffer = psVar1;
                            }
                            *pbVar28 = bVar23;
                            pbVar28 = pbVar28 + 4;
                            uVar16 = uVar16 - 1;
                          } while (uVar16 != 0);
LAB_00168903:
                          iVar14 = iVar14 + uVar25;
                        }
                        uVar16 = uVar21 - iVar14;
                      } while (uVar16 != 0 && iVar14 <= (int)uVar21);
                    }
                  }
                  else if (0 < (int)uVar21) {
                    uVar22 = 0;
                    cVar7 = -(uVar19 == 3);
                    do {
                      auVar32 = vpbroadcastq_avx512f();
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6a00);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x7e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x7c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x7a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x78) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x76) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x74) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x72) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x70) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c69c0);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x6e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x6c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x6a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x68) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x66) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -100) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x62) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x60) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6980);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x5e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x5c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x5a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x58) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x56) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x54) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x52) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x50) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6940);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x4e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x4c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x4a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x48) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x46) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x44) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x42) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x40) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6900);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x3e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x3c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x3a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x38) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x36) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x34) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x32) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x30) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c68c0);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x2e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x2c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x2a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x28) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x26) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x24) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x22) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x20) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar32,_DAT_001c6880);
                      uVar5 = vpcmpuq_avx512f(auVar33,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x1e) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x1c) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x1a) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x18) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x16) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x14) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x12) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0x10) = cVar7;
                      }
                      auVar32 = vporq_avx512f(auVar32,_DAT_001c6840);
                      uVar5 = vpcmpuq_avx512f(auVar32,auVar31,2);
                      if ((uVar5 & 1) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0xe) = cVar7;
                      }
                      if ((uVar5 & 2) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -0xc) = cVar7;
                      }
                      if ((uVar5 & 4) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -10) = cVar7;
                      }
                      if ((uVar5 & 8) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -8) = cVar7;
                      }
                      if ((uVar5 & 0x10) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -6) = cVar7;
                      }
                      if ((uVar5 & 0x20) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -4) = cVar7;
                      }
                      if ((uVar5 & 0x40) != 0) {
                        *(char *)(psVar26 + uVar22 * 2 + -2) = cVar7;
                      }
                      if ((uVar5 & 0x80) != 0) {
                        *(char *)(psVar26 + uVar22 * 2) = cVar7;
                      }
                      uVar22 = uVar22 + 0x40;
                    } while (((ulong)(uint)((iVar11 + iVar9) * (iVar13 + iVar12)) + 0x3f &
                             0xffffffffffffffc0) != uVar22);
                  }
                  auVar42 = in_ZMM5._4_12_;
                  psVar26 = (stbi__uint16 *)((long)psVar26 + 1);
                  uVar19 = uVar19 + 1;
                } while (uVar19 != 4);
              }
              if (3 < uVar10) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar21) {
                    uVar19 = 0;
                    do {
                      uVar3 = data[uVar19 * 4 + 3];
                      if ((uVar3 != 0) && (uVar3 != 0xffff)) {
                        auVar38 = vpmovzxwd_avx(ZEXT416(*(uint *)(data + uVar19 * 4)));
                        auVar38 = vcvtdq2ps_avx(auVar38);
                        fVar34 = 1.0 / ((float)uVar3 / 65535.0);
                        auVar41._4_4_ = fVar34;
                        auVar41._0_4_ = fVar34;
                        auVar41._8_4_ = fVar34;
                        auVar41._12_4_ = fVar34;
                        fVar35 = (1.0 - fVar34) * 65535.0;
                        auVar43._4_4_ = fVar35;
                        auVar43._0_4_ = fVar35;
                        auVar43._8_4_ = fVar35;
                        auVar43._12_4_ = fVar35;
                        auVar38 = vfmadd231ps_fma(auVar43,auVar38,auVar41);
                        auVar36._0_4_ = (int)auVar38._0_4_;
                        auVar36._4_4_ = (int)auVar38._4_4_;
                        auVar36._8_4_ = (int)auVar38._8_4_;
                        auVar36._12_4_ = (int)auVar38._12_4_;
                        auVar38 = vpshuflw_avx(auVar36,0xe8);
                        *(int *)(data + uVar19 * 4) = auVar38._0_4_;
                        auVar37._0_4_ = (float)data[uVar19 * 4 + 2];
                        auVar37._4_12_ = in_register_000013c4;
                        auVar38 = vfmadd213ss_fma(auVar37,ZEXT416((uint)fVar34),
                                                  ZEXT416((uint)fVar35));
                        data[uVar19 * 4 + 2] = (stbi__uint16)(int)auVar38._0_4_;
                      }
                      uVar19 = uVar19 + 1;
                    } while ((uint)((iVar11 + iVar9) * (iVar13 + iVar12)) != uVar19);
                  }
                }
                else if (0 < (int)uVar21) {
                  uVar19 = 0;
                  do {
                    bVar23 = *(byte *)((long)data + uVar19 * 4 + 3);
                    if ((bVar23 != 0) && (bVar23 != 0xff)) {
                      auVar38._0_4_ = (float)(byte)data[uVar19 * 2];
                      auVar38._4_12_ = auVar42;
                      fVar35 = 1.0 / ((float)bVar23 / 255.0);
                      auVar36 = ZEXT416((uint)fVar35);
                      fVar35 = (1.0 - fVar35) * 255.0;
                      auVar38 = vfmadd213ss_fma(auVar38,auVar36,ZEXT416((uint)fVar35));
                      *(char *)(data + uVar19 * 2) = (char)(int)auVar38._0_4_;
                      auVar39._0_4_ = (float)*(byte *)((long)data + uVar19 * 4 + 1);
                      auVar39._4_12_ = auVar42;
                      auVar38 = vfmadd213ss_fma(auVar39,auVar36,ZEXT416((uint)fVar35));
                      *(char *)((long)data + uVar19 * 4 + 1) = (char)(int)auVar38._0_4_;
                      auVar40._0_4_ = (float)(byte)data[uVar19 * 2 + 1];
                      auVar40._4_12_ = auVar42;
                      auVar38 = vfmadd213ss_fma(auVar40,auVar36,ZEXT416((uint)fVar35));
                      *(char *)(data + uVar19 * 2 + 1) = (char)(int)auVar38._0_4_;
                    }
                    uVar19 = uVar19 + 1;
                  } while ((uint)((iVar11 + iVar9) * (iVar13 + iVar12)) != uVar19);
                }
              }
              if ((req_comp & 0xfffffffbU) != 0) {
                if (ri->bits_per_channel == 0x10) {
                  data = stbi__convert_format16(data,4,req_comp,x_00,y_00);
                }
                else {
                  data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,y_00);
                }
                if (data == (stbi__uint16 *)0x0) {
                  return (void *)0x0;
                }
              }
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
            stbi__g_failure_reason = "outofmem";
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}